

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O3

Token __thiscall flow::lang::Lexer::parseEnvVar(Lexer *this)

{
  string *psVar1;
  long *plVar2;
  char *pcVar3;
  int iVar4;
  char *__s;
  
  psVar1 = &this->stringValue_;
  (this->stringValue_)._M_string_length = 0;
  *(this->stringValue_)._M_dataplus._M_p = '\0';
  while( true ) {
    nextChar(this,true);
    iVar4 = this->currentChar_;
    if ((iVar4 == -1) ||
       (plVar2 = (long *)(this->contexts_).
                         super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
                         ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[4]._M_next,
       (*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 2) != 0)) break;
    if (iVar4 != 0x5f) {
      iVar4 = isalnum(iVar4);
      if (iVar4 == 0) break;
    }
    std::__cxx11::string::push_back((char)psVar1);
  }
  pcVar3 = (psVar1->_M_dataplus)._M_p;
  __s = getenv(pcVar3);
  if (__s == (char *)0x0) {
    (this->stringValue_)._M_string_length = 0;
    *pcVar3 = '\0';
  }
  else {
    pcVar3 = (char *)(this->stringValue_)._M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar3,(ulong)__s);
  }
  return String;
}

Assistant:

Token Lexer::parseEnvVar() {
  stringValue_.clear();
  nextChar(); // skip leading '$'

  while (!eof() && (currentChar() == '_' || std::isalnum(currentChar()))) {
    stringValue_ += static_cast<char>(currentChar());
    nextChar();
  }

  if (char* value = getenv(stringValue_.c_str()); value != nullptr) {
    stringValue_ = value;
  } else {
    stringValue_.clear();
  }

  return Token::String;
}